

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O1

ConversionResult
llvm::ConvertUTF8toUTF32Impl
          (UTF8 **sourceStart,UTF8 *sourceEnd,UTF32 **targetStart,UTF32 *targetEnd,
          ConversionFlags flags,Boolean InputIsPartial)

{
  byte bVar1;
  Boolean BVar2;
  ConversionResult CVar3;
  uint uVar4;
  uint *puVar5;
  ConversionResult CVar6;
  undefined3 in_register_00000089;
  uint uVar7;
  byte *source;
  bool bVar8;
  bool bVar9;
  
  source = *sourceStart;
  puVar5 = *targetStart;
  CVar3 = conversionOK;
  do {
    CVar6 = CVar3;
    if (sourceEnd <= source) break;
    bVar1 = trailingBytesForUTF8[*source];
    uVar7 = (int)(char)bVar1 & 0xffff;
    if ((long)(ulong)uVar7 < (long)sourceEnd - (long)source) {
      bVar8 = true;
      CVar6 = targetExhausted;
      if (puVar5 < targetEnd) {
        BVar2 = isLegalUTF8(source,uVar7 + 1);
        if (BVar2 == '\0') {
          CVar6 = sourceIllegal;
          bVar8 = flags == strictConversion;
          if (!bVar8) {
            uVar7 = findMaximalSubpartOfIllFormedUTF8Sequence(source,sourceEnd);
            source = source + uVar7;
            *puVar5 = 0xfffd;
            puVar5 = puVar5 + 1;
          }
        }
        else {
          if ((byte)uVar7 < 6) {
            CVar3 = (*(code *)(&DAT_001abc88 + *(int *)(&DAT_001abc88 + (ulong)bVar1 * 4)))();
            return CVar3;
          }
          uVar4 = -*(int *)(offsetsFromUTF8 + (ulong)uVar7 * 4);
          if (uVar4 < 0x110000) {
            bVar9 = (uVar4 & 0x1ff800) == 0xd800;
            if (bVar9) {
              uVar4 = 0xfffd;
            }
            if (bVar9 && flags == strictConversion) {
              source = source + -(ulong)(uVar7 + 1);
              CVar6 = sourceIllegal;
              goto LAB_00181ea0;
            }
          }
          else {
            CVar3 = sourceIllegal;
            uVar4 = 0xfffd;
          }
          *puVar5 = uVar4;
          puVar5 = puVar5 + 1;
          bVar8 = false;
          CVar6 = CVar3;
        }
      }
    }
    else if (CONCAT31(in_register_00000089,InputIsPartial) == 0 && flags != strictConversion) {
      uVar7 = findMaximalSubpartOfIllFormedUTF8Sequence(source,sourceEnd);
      source = source + uVar7;
      *puVar5 = 0xfffd;
      puVar5 = puVar5 + 1;
      CVar6 = sourceIllegal;
      bVar8 = false;
    }
    else {
      bVar8 = true;
      CVar6 = sourceExhausted;
    }
LAB_00181ea0:
    CVar3 = CVar6;
  } while (!bVar8);
  *sourceStart = source;
  *targetStart = puVar5;
  return CVar6;
}

Assistant:

static ConversionResult ConvertUTF8toUTF32Impl(
        const UTF8** sourceStart, const UTF8* sourceEnd,
        UTF32** targetStart, UTF32* targetEnd, ConversionFlags flags,
        Boolean InputIsPartial) {
    ConversionResult result = conversionOK;
    const UTF8* source = *sourceStart;
    UTF32* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch = 0;
        unsigned short extraBytesToRead = trailingBytesForUTF8[*source];
        if (extraBytesToRead >= sourceEnd - source) {
            if (flags == strictConversion || InputIsPartial) {
                result = sourceExhausted;
                break;
            } else {
                result = sourceIllegal;

                /*
                 * Replace the maximal subpart of ill-formed sequence with
                 * replacement character.
                 */
                source += findMaximalSubpartOfIllFormedUTF8Sequence(source,
                                                                    sourceEnd);
                *target++ = UNI_REPLACEMENT_CHAR;
                continue;
            }
        }
        if (target >= targetEnd) {
            result = targetExhausted; break;
        }

        /* Do this check whether lenient or strict */
        if (!isLegalUTF8(source, extraBytesToRead+1)) {
            result = sourceIllegal;
            if (flags == strictConversion) {
                /* Abort conversion. */
                break;
            } else {
                /*
                 * Replace the maximal subpart of ill-formed sequence with
                 * replacement character.
                 */
                source += findMaximalSubpartOfIllFormedUTF8Sequence(source,
                                                                    sourceEnd);
                *target++ = UNI_REPLACEMENT_CHAR;
                continue;
            }
        }
        /*
         * The cases all fall through. See "Note A" below.
         */
        switch (extraBytesToRead) {
            case 5: ch += *source++; ch <<= 6;
            case 4: ch += *source++; ch <<= 6;
            case 3: ch += *source++; ch <<= 6;
            case 2: ch += *source++; ch <<= 6;
            case 1: ch += *source++; ch <<= 6;
            case 0: ch += *source++;
        }
        ch -= offsetsFromUTF8[extraBytesToRead];

        if (ch <= UNI_MAX_LEGAL_UTF32) {
            /*
             * UTF-16 surrogate values are illegal in UTF-32, and anything
             * over Plane 17 (> 0x10FFFF) is illegal.
             */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END) {
                if (flags == strictConversion) {
                    source -= (extraBytesToRead+1); /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                } else {
                    *target++ = UNI_REPLACEMENT_CHAR;
                }
            } else {
                *target++ = ch;
            }
        } else { /* i.e., ch > UNI_MAX_LEGAL_UTF32 */
            result = sourceIllegal;
            *target++ = UNI_REPLACEMENT_CHAR;
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}